

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_genericmodel.cpp
# Opt level: O2

void __thiscall tst_GenericModel::removeColumns(tst_GenericModel *this)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  char cVar4;
  byte bVar5;
  int iVar6;
  uint *puVar7;
  long lVar8;
  value_type args;
  GenericModel testModel;
  QSignalSpy *spyArr [2];
  QModelIndex local_170;
  ModelTest probe;
  QModelIndex local_148;
  QSignalSpy columnsAboutToBeRemovedSpy;
  QSignalSpy columnsRemovedSpy;
  
  puVar7 = (uint *)QTest::qData("insertRow",2);
  uVar1 = *puVar7;
  GenericModel::GenericModel(&testModel,(QObject *)0x0);
  ModelTest::ModelTest(&probe,(QAbstractItemModel *)&testModel,(QObject *)0x0);
  if (0 < (int)uVar1) {
    columnsAboutToBeRemovedSpy.super_QObject = (QObject)0xff;
    columnsAboutToBeRemovedSpy._1_7_ = 0xffffffffffffff;
    columnsAboutToBeRemovedSpy._8_8_ = 0;
    columnsAboutToBeRemovedSpy.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
    GenericModel::insertRows((int)&testModel,0,(QModelIndex *)(ulong)uVar1);
  }
  columnsAboutToBeRemovedSpy.super_QObject = (QObject)0xff;
  columnsAboutToBeRemovedSpy._1_7_ = 0xffffffffffffff;
  columnsAboutToBeRemovedSpy._8_8_ = 0;
  columnsAboutToBeRemovedSpy.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
  bVar3 = (bool)GenericModel::insertColumns((int)&testModel,0,(QModelIndex *)0xd);
  cVar4 = QTest::qVerify(bVar3,"testModel.insertColumns(0, 13)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x18e);
  if (cVar4 == '\0') goto LAB_0010c3a5;
  QVariant::QVariant((QVariant *)&columnsAboutToBeRemovedSpy,1);
  GenericModel::setHeaderData((int)&testModel,10,(QVariant *)0x1,(int)&columnsAboutToBeRemovedSpy);
  QVariant::~QVariant((QVariant *)&columnsAboutToBeRemovedSpy);
  QSignalSpy::QSignalSpy
            (&columnsAboutToBeRemovedSpy,(QObject *)&testModel,
             "2columnsAboutToBeRemoved(QModelIndex, int, int)");
  cVar4 = QTest::qVerify(columnsAboutToBeRemovedSpy.sig.d.size != 0,
                         "columnsAboutToBeRemovedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x192);
  if (cVar4 != '\0') {
    QSignalSpy::QSignalSpy
              (&columnsRemovedSpy,(QObject *)&testModel,"2columnsRemoved(QModelIndex, int, int)");
    cVar4 = QTest::qVerify(columnsRemovedSpy.sig.d.size != 0,"columnsRemovedSpy.isValid()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                           ,0x194);
    if (cVar4 != '\0') {
      args.d.d = (Data *)0xffffffffffffffff;
      args.d.ptr = (QVariant *)0x0;
      args.d.size = 0;
      spyArr[0] = &columnsRemovedSpy;
      spyArr[1] = &columnsAboutToBeRemovedSpy;
      bVar3 = (bool)GenericModel::removeColumns((int)&testModel,0,(QModelIndex *)0x1);
      cVar4 = QTest::qVerify(bVar3,"testModel.removeColumns(0, 1)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x197);
      if (cVar4 != '\0') {
        args.d.d = (Data *)0xffffffffffffffff;
        args.d.ptr = (QVariant *)0x0;
        args.d.size = 0;
        iVar6 = GenericModel::columnCount((QModelIndex *)&testModel);
        cVar4 = QTest::qCompare(iVar6,0xc,"testModel.columnCount()","12",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                ,0x198);
        if (cVar4 != '\0') {
          lVar8 = 0;
          do {
            if (lVar8 == 0x10) {
              GenericModel::headerData((int)&args,(Orientation)&testModel,9);
              iVar6 = QVariant::toInt((bool *)&args);
              cVar4 = QTest::qCompare(iVar6,1,"testModel.headerData(9, Qt::Horizontal).toInt()","1",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                      ,0x1a0);
              QVariant::~QVariant((QVariant *)&args);
              if (cVar4 != '\0') {
                args.d.d = (Data *)0xffffffffffffffff;
                args.d.ptr = (QVariant *)0x0;
                args.d.size = 0;
                bVar3 = (bool)GenericModel::removeColumns((int)&testModel,0,(QModelIndex *)0x2);
                cVar4 = QTest::qVerify(bVar3,"testModel.removeColumns(0, 2)","",
                                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                       ,0x1a1);
                if (cVar4 != '\0') {
                  args.d.d = (Data *)0xffffffffffffffff;
                  args.d.ptr = (QVariant *)0x0;
                  args.d.size = 0;
                  iVar6 = GenericModel::columnCount((QModelIndex *)&testModel);
                  cVar4 = QTest::qCompare(iVar6,10,"testModel.columnCount()","10",
                                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                          ,0x1a2);
                  if (cVar4 != '\0') {
                    lVar8 = 0;
                    goto LAB_0010c057;
                  }
                }
              }
              break;
            }
            lVar2 = *(long *)((long)spyArr + lVar8);
            cVar4 = QTest::qCompare(*(longlong *)(lVar2 + 0x20),1,"spy->count()","1",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                    ,0x19a);
            if (cVar4 == '\0') break;
            QList<QList<QVariant>_>::takeFirst
                      ((value_type *)&args.d,(QList<QList<QVariant>_> *)(lVar2 + 0x10));
            iVar6 = QVariant::toInt((bool *)(args.d.ptr + 2));
            cVar4 = QTest::qCompare(iVar6,0,"args.at(2).toInt()","0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                    ,0x19c);
            if (cVar4 == '\0') goto LAB_0010c381;
            iVar6 = QVariant::toInt((bool *)(args.d.ptr + 1));
            cVar4 = QTest::qCompare(iVar6,0,"args.at(1).toInt()","0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                    ,0x19d);
            if (cVar4 == '\0') goto LAB_0010c381;
            qvariant_cast<QModelIndex>(&local_148,args.d.ptr);
            local_170.r = -1;
            local_170.c = -1;
            local_170.i = 0;
            local_170.m = (QAbstractItemModel *)0x0;
            bVar3 = QTest::qCompare<QModelIndex,QModelIndex>
                              (&local_148,&local_170,"args.at(0).value<QModelIndex>()",
                               "QModelIndex()",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                               ,0x19e);
            QArrayDataPointer<QVariant>::~QArrayDataPointer(&args.d);
            lVar8 = lVar8 + 8;
          } while (bVar3);
        }
      }
    }
    goto LAB_0010c38b;
  }
  goto LAB_0010c398;
  while( true ) {
    lVar2 = *(long *)((long)spyArr + lVar8);
    cVar4 = QTest::qCompare(*(longlong *)(lVar2 + 0x20),1,"spy->count()","1",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x1a4);
    if (cVar4 == '\0') break;
    QList<QList<QVariant>_>::takeFirst
              ((value_type *)&args.d,(QList<QList<QVariant>_> *)(lVar2 + 0x10));
    iVar6 = QVariant::toInt((bool *)(args.d.ptr + 2));
    cVar4 = QTest::qCompare(iVar6,1,"args.at(2).toInt()","1",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x1a6);
    if (cVar4 == '\0') goto LAB_0010c381;
    iVar6 = QVariant::toInt((bool *)(args.d.ptr + 1));
    cVar4 = QTest::qCompare(iVar6,0,"args.at(1).toInt()","0",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x1a7);
    if (cVar4 == '\0') goto LAB_0010c381;
    qvariant_cast<QModelIndex>(&local_148,args.d.ptr);
    local_170.r = -1;
    local_170.c = -1;
    local_170.i = 0;
    local_170.m = (QAbstractItemModel *)0x0;
    bVar3 = QTest::qCompare<QModelIndex,QModelIndex>
                      (&local_148,&local_170,"args.at(0).value<QModelIndex>()","QModelIndex()",
                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                       ,0x1a8);
    QArrayDataPointer<QVariant>::~QArrayDataPointer(&args.d);
    lVar8 = lVar8 + 8;
    if (!bVar3) break;
LAB_0010c057:
    if (lVar8 == 0x10) {
      GenericModel::headerData((int)&args,(Orientation)&testModel,7);
      iVar6 = QVariant::toInt((bool *)&args);
      cVar4 = QTest::qCompare(iVar6,1,"testModel.headerData(7, Qt::Horizontal).toInt()","1",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x1aa);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar4 != '\0') {
        args.d.d = (Data *)0xffffffffffffffff;
        args.d.ptr = (QVariant *)0x0;
        args.d.size = 0;
        bVar3 = (bool)GenericModel::removeColumns((int)&testModel,2,(QModelIndex *)0x2);
        cVar4 = QTest::qVerify(bVar3,"testModel.removeColumns(2, 2)","",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                               ,0x1ac);
        if (cVar4 != '\0') {
          args.d.d = (Data *)0xffffffffffffffff;
          args.d.ptr = (QVariant *)0x0;
          args.d.size = 0;
          iVar6 = GenericModel::columnCount((QModelIndex *)&testModel);
          cVar4 = QTest::qCompare(iVar6,8,"testModel.columnCount()","8",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                  ,0x1ad);
          if (cVar4 != '\0') {
            lVar8 = 0;
            goto LAB_0010c26f;
          }
        }
      }
      break;
    }
  }
  goto LAB_0010c38b;
  while( true ) {
    lVar2 = *(long *)((long)spyArr + lVar8);
    cVar4 = QTest::qCompare(*(longlong *)(lVar2 + 0x20),1,"spy->count()","1",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x1af);
    if (cVar4 == '\0') break;
    QList<QList<QVariant>_>::takeFirst
              ((value_type *)&args.d,(QList<QList<QVariant>_> *)(lVar2 + 0x10));
    iVar6 = QVariant::toInt((bool *)(args.d.ptr + 2));
    cVar4 = QTest::qCompare(iVar6,3,"args.at(2).toInt()","3",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x1b1);
    if (cVar4 == '\0') goto LAB_0010c381;
    iVar6 = QVariant::toInt((bool *)(args.d.ptr + 1));
    cVar4 = QTest::qCompare(iVar6,2,"args.at(1).toInt()","2",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x1b2);
    if (cVar4 == '\0') goto LAB_0010c381;
    qvariant_cast<QModelIndex>(&local_148,args.d.ptr);
    local_170.r = -1;
    local_170.c = -1;
    local_170.i = 0;
    local_170.m = (QAbstractItemModel *)0x0;
    bVar3 = QTest::qCompare<QModelIndex,QModelIndex>
                      (&local_148,&local_170,"args.at(0).value<QModelIndex>()","QModelIndex()",
                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                       ,0x1b3);
    QArrayDataPointer<QVariant>::~QArrayDataPointer(&args.d);
    lVar8 = lVar8 + 8;
    if (!bVar3) break;
LAB_0010c26f:
    if (lVar8 == 0x10) {
      GenericModel::headerData((int)&args,(Orientation)&testModel,5);
      iVar6 = QVariant::toInt((bool *)&args);
      cVar4 = QTest::qCompare(iVar6,1,"testModel.headerData(5, Qt::Horizontal).toInt()","1",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x1b5);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar4 != '\0') {
        args.d.d = (Data *)0xffffffffffffffff;
        args.d.ptr = (QVariant *)0x0;
        args.d.size = 0;
        bVar5 = GenericModel::removeColumns((int)&testModel,0,(QModelIndex *)0x0);
        cVar4 = QTest::qVerify((bool)(bVar5 ^ 1),"!testModel.removeColumns(0, 0)","",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                               ,0x1b7);
        if (cVar4 != '\0') {
          args.d.d = (Data *)0xffffffffffffffff;
          args.d.ptr = (QVariant *)0x0;
          args.d.size = 0;
          iVar6 = GenericModel::columnCount((QModelIndex *)&testModel);
          cVar4 = QTest::qCompare(iVar6,8,"testModel.columnCount()","8",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                  ,0x1b8);
          if (cVar4 != '\0') {
            lVar8 = 0;
            goto LAB_0010c4d2;
          }
        }
      }
      break;
    }
  }
  goto LAB_0010c38b;
  while( true ) {
    cVar4 = QTest::qCompare(*(longlong *)(*(long *)((long)spyArr + lVar8) + 0x20),0,"spy->count()",
                            "0",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x1ba);
    lVar8 = lVar8 + 8;
    if (cVar4 == '\0') break;
LAB_0010c4d2:
    if (lVar8 == 0x10) {
      args.d.d = (Data *)0xffffffffffffffff;
      args.d.ptr = (QVariant *)0x0;
      args.d.size = 0;
      bVar5 = GenericModel::removeColumns((int)&testModel,2,(QModelIndex *)0x0);
      cVar4 = QTest::qVerify((bool)(bVar5 ^ 1),"!testModel.removeColumns(2, 0)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x1bb);
      if (cVar4 != '\0') {
        args.d.d = (Data *)0xffffffffffffffff;
        args.d.ptr = (QVariant *)0x0;
        args.d.size = 0;
        iVar6 = GenericModel::columnCount((QModelIndex *)&testModel);
        cVar4 = QTest::qCompare(iVar6,8,"testModel.columnCount()","8",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                ,0x1bc);
        if (cVar4 != '\0') {
          lVar8 = 0;
          goto LAB_0010c5af;
        }
      }
      break;
    }
  }
  goto LAB_0010c38b;
  while( true ) {
    cVar4 = QTest::qCompare(*(longlong *)(*(long *)((long)spyArr + lVar8) + 0x20),0,"spy->count()",
                            "0",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x1be);
    lVar8 = lVar8 + 8;
    if (cVar4 == '\0') break;
LAB_0010c5af:
    if (lVar8 == 0x10) {
      args.d.d = (Data *)0xffffffffffffffff;
      args.d.ptr = (QVariant *)0x0;
      args.d.size = 0;
      bVar5 = GenericModel::removeColumns((int)&testModel,-1,(QModelIndex *)0x2);
      cVar4 = QTest::qVerify((bool)(bVar5 ^ 1),"!testModel.removeColumns(-1, 2)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x1bf);
      if (cVar4 != '\0') {
        args.d.d = (Data *)0xffffffffffffffff;
        args.d.ptr = (QVariant *)0x0;
        args.d.size = 0;
        iVar6 = GenericModel::columnCount((QModelIndex *)&testModel);
        cVar4 = QTest::qCompare(iVar6,8,"testModel.columnCount()","8",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                ,0x1c0);
        if (cVar4 != '\0') {
          lVar8 = 0;
          goto LAB_0010c68d;
        }
      }
      break;
    }
  }
  goto LAB_0010c38b;
  while( true ) {
    cVar4 = QTest::qCompare(*(longlong *)(*(long *)((long)spyArr + lVar8) + 0x20),0,"spy->count()",
                            "0",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x1c2);
    lVar8 = lVar8 + 8;
    if (cVar4 == '\0') break;
LAB_0010c68d:
    if (lVar8 == 0x10) {
      args.d.d = (Data *)0xffffffffffffffff;
      args.d.ptr = (QVariant *)0x0;
      args.d.size = 0;
      bVar5 = GenericModel::removeColumns((int)&testModel,9,(QModelIndex *)0x2);
      cVar4 = QTest::qVerify((bool)(bVar5 ^ 1),"!testModel.removeColumns(9, 2)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x1c3);
      if (cVar4 != '\0') {
        args.d.d = (Data *)0xffffffffffffffff;
        args.d.ptr = (QVariant *)0x0;
        args.d.size = 0;
        iVar6 = GenericModel::columnCount((QModelIndex *)&testModel);
        cVar4 = QTest::qCompare(iVar6,8,"testModel.columnCount()","8",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                ,0x1c4);
        if (cVar4 != '\0') {
          lVar8 = 0;
          goto LAB_0010c76b;
        }
      }
      break;
    }
  }
  goto LAB_0010c38b;
LAB_0010c381:
  QArrayDataPointer<QVariant>::~QArrayDataPointer(&args.d);
  goto LAB_0010c38b;
  while( true ) {
    cVar4 = QTest::qCompare(*(longlong *)(*(long *)((long)spyArr + lVar8) + 0x20),0,"spy->count()",
                            "0",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x1c6);
    lVar8 = lVar8 + 8;
    if (cVar4 == '\0') break;
LAB_0010c76b:
    if (lVar8 == 0x10) break;
  }
LAB_0010c38b:
  QSignalSpy::~QSignalSpy(&columnsRemovedSpy);
LAB_0010c398:
  QSignalSpy::~QSignalSpy(&columnsAboutToBeRemovedSpy);
LAB_0010c3a5:
  QObject::~QObject((QObject *)&probe);
  GenericModel::~GenericModel(&testModel);
  return;
}

Assistant:

void tst_GenericModel::removeColumns()
{
    QFETCH(int, insertRow);
    GenericModel testModel;
    ModelTest probe(&testModel, nullptr);
    if (insertRow > 0)
        testModel.insertRows(0, insertRow);
    QVERIFY(testModel.insertColumns(0, 13));
    testModel.setHeaderData(10, Qt::Horizontal, 1);

    QSignalSpy columnsAboutToBeRemovedSpy(&testModel, SIGNAL(columnsAboutToBeRemoved(QModelIndex, int, int)));
    QVERIFY(columnsAboutToBeRemovedSpy.isValid());
    QSignalSpy columnsRemovedSpy(&testModel, SIGNAL(columnsRemoved(QModelIndex, int, int)));
    QVERIFY(columnsRemovedSpy.isValid());
    QSignalSpy *const spyArr[] = {&columnsRemovedSpy, &columnsAboutToBeRemovedSpy};

    QVERIFY(testModel.removeColumns(0, 1));
    QCOMPARE(testModel.columnCount(), 12);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(2).toInt(), 0);
        QCOMPARE(args.at(1).toInt(), 0);
        QCOMPARE(args.at(0).value<QModelIndex>(), QModelIndex());
    }
    QCOMPARE(testModel.headerData(9, Qt::Horizontal).toInt(), 1);
    QVERIFY(testModel.removeColumns(0, 2));
    QCOMPARE(testModel.columnCount(), 10);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(2).toInt(), 1);
        QCOMPARE(args.at(1).toInt(), 0);
        QCOMPARE(args.at(0).value<QModelIndex>(), QModelIndex());
    }
    QCOMPARE(testModel.headerData(7, Qt::Horizontal).toInt(), 1);

    QVERIFY(testModel.removeColumns(2, 2));
    QCOMPARE(testModel.columnCount(), 8);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(2).toInt(), 3);
        QCOMPARE(args.at(1).toInt(), 2);
        QCOMPARE(args.at(0).value<QModelIndex>(), QModelIndex());
    }
    QCOMPARE(testModel.headerData(5, Qt::Horizontal).toInt(), 1);

    QVERIFY(!testModel.removeColumns(0, 0));
    QCOMPARE(testModel.columnCount(), 8);
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.removeColumns(2, 0));
    QCOMPARE(testModel.columnCount(), 8);
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.removeColumns(-1, 2));
    QCOMPARE(testModel.columnCount(), 8);
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.removeColumns(9, 2));
    QCOMPARE(testModel.columnCount(), 8);
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
}